

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilterFederate.cpp
# Opt level: O0

void __thiscall
helics::FilterFederate::acceptProcessReturn(FilterFederate *this,GlobalFederateId fid,uint32_t pid)

{
  bool bVar1;
  BaseType in_ESI;
  long in_RDI;
  ActionMessage unblock;
  BaseType fid_index;
  ActionMessage *in_stack_fffffffffffffef8;
  set<int,_std::less<int>,_std::allocator<int>_> *in_stack_ffffffffffffff00;
  ActionMessage *this_00;
  action_t in_stack_ffffffffffffff1c;
  undefined4 in_stack_ffffffffffffff20;
  GlobalFederateId in_stack_ffffffffffffff24;
  GlobalFederateId local_d0;
  GlobalFederateId in_stack_ffffffffffffff38;
  InterfaceHandle in_stack_ffffffffffffff3c;
  undefined4 in_stack_ffffffffffffff40;
  uint32_t in_stack_ffffffffffffff44;
  int32_t in_stack_ffffffffffffff5c;
  Time in_stack_ffffffffffffff60;
  GlobalFederateId local_4;
  
  local_4.gid = in_ESI;
  GlobalFederateId::baseValue(&local_4);
  std::
  map<int,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
  ::operator[]((map<int,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
                *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
               (key_type *)CONCAT44(in_stack_ffffffffffffff3c.hid,in_stack_ffffffffffffff38.gid));
  std::set<int,_std::less<int>,_std::allocator<int>_>::erase
            (in_stack_ffffffffffffff00,&in_stack_fffffffffffffef8->messageAction);
  std::
  map<int,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
  ::operator[]((map<int,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
                *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
               (key_type *)CONCAT44(in_stack_ffffffffffffff3c.hid,in_stack_ffffffffffffff38.gid));
  bVar1 = std::set<int,_std::less<int>,_std::allocator<int>_>::empty
                    ((set<int,_std::less<int>,_std::allocator<int>_> *)0x6419b6);
  if (bVar1) {
    this_00 = (ActionMessage *)&stack0xffffffffffffff28;
    ActionMessage::ActionMessage
              ((ActionMessage *)CONCAT44(in_stack_ffffffffffffff24.gid,in_stack_ffffffffffffff20),
               in_stack_ffffffffffffff1c);
    GlobalFederateId::GlobalFederateId
              ((GlobalFederateId *)&stack0xffffffffffffff24,
               (GlobalBrokerId)*(BaseType *)(in_RDI + 4));
    local_d0.gid = local_4.gid;
    std::function<void_(const_helics::ActionMessage_&)>::operator()
              ((function<void_(const_helics::ActionMessage_&)> *)this_00,in_stack_fffffffffffffef8);
    ActionMessage::~ActionMessage(this_00);
  }
  clearTimeReturn((FilterFederate *)in_stack_ffffffffffffff60.internalTimeCode,
                  in_stack_ffffffffffffff5c);
  return;
}

Assistant:

void FilterFederate::acceptProcessReturn(GlobalFederateId fid, uint32_t pid)
{
    // nothing further to process
    auto fid_index = fid.baseValue();
    ongoingFilterProcesses[fid_index].erase(pid);
    if (ongoingFilterProcesses[fid_index].empty()) {
        ActionMessage unblock(CMD_TIME_UNBLOCK);
        unblock.dest_id = mCoreID;
        unblock.source_id = fid;
        unblock.sequenceID = pid;
        mSendMessage(unblock);
    }
    clearTimeReturn(pid);
}